

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::Branch::Branch
          (Branch *this,ArrayJoinPromiseNodeBase *joinNode,Own<kj::_::PromiseNode> *dependencyParam,
          ExceptionOrValue *output)

{
  PromiseNode *pPVar1;
  EventLoop *pEVar2;
  
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_0064c6a0;
  pEVar2 = anon_unknown_54::currentEventLoop();
  (this->super_Event).loop = pEVar2;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_0064c8f0;
  this->joinNode = joinNode;
  (this->dependency).disposer = dependencyParam->disposer;
  (this->dependency).ptr = dependencyParam->ptr;
  dependencyParam->ptr = (PromiseNode *)0x0;
  this->output = output;
  pPVar1 = (this->dependency).ptr;
  (*pPVar1->_vptr_PromiseNode[1])(pPVar1,&this->dependency);
  pPVar1 = (this->dependency).ptr;
  (**pPVar1->_vptr_PromiseNode)(pPVar1,this);
  return;
}

Assistant:

ArrayJoinPromiseNodeBase::Branch::Branch(
    ArrayJoinPromiseNodeBase& joinNode, Own<PromiseNode> dependencyParam, ExceptionOrValue& output)
    : joinNode(joinNode), dependency(kj::mv(dependencyParam)), output(output) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}